

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O1

void chacha20poly1305_finalize(chacha20poly1305_context_t *ctx,uint8_t *tag)

{
  cf_poly1305 *ctx_00;
  ulong uVar1;
  uint8_t lenbuf [16];
  size_t local_28;
  size_t local_20;
  
  ctx_00 = &ctx->poly;
  uVar1 = ctx->textlen & 0xf;
  if (uVar1 != 0) {
    cf_poly1305_update(ctx_00,"",0x10 - uVar1);
  }
  local_28 = ctx->aadlen;
  local_20 = ctx->textlen;
  cf_poly1305_update(ctx_00,(uint8_t *)&local_28,0x10);
  cf_poly1305_finish(ctx_00,tag);
  return;
}

Assistant:

static void chacha20poly1305_finalize(struct chacha20poly1305_context_t *ctx, uint8_t *tag)
{
    uint8_t lenbuf[16];

    chacha20poly1305_encrypt_pad(&ctx->poly, ctx->textlen);

    write64_le(ctx->aadlen, lenbuf);
    write64_le(ctx->textlen, lenbuf + 8);
    cf_poly1305_update(&ctx->poly, lenbuf, sizeof(lenbuf));

    cf_poly1305_finish(&ctx->poly, tag);
}